

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_dictionary.hpp
# Opt level: O3

bool __thiscall
ArgumentDictionary::get_boolean(ArgumentDictionary *this,string *name,bool default_value)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  bool bVar7;
  string contents;
  string negation_param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"no",name);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_40);
  if ((_Rb_tree_header *)cVar4._M_node == &(this->_args_map)._M_t._M_impl.super__Rb_tree_header) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->_args_map,name);
    pcVar1 = (pmVar5->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + pmVar5->_M_string_length);
    _Var2._M_p = local_60._M_dataplus._M_p;
    if (local_60._M_string_length != 0) {
      sVar6 = 0;
      do {
        iVar3 = tolower((uint)(byte)_Var2._M_p[sVar6]);
        _Var2._M_p[sVar6] = (char)iVar3;
        sVar6 = sVar6 + 1;
      } while (local_60._M_string_length != sVar6);
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_60,"false");
    bVar7 = iVar3 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

[[nodiscard]] bool get_boolean(const std::string& name, bool default_value = false) const
    {
        // "--noParam" <==> "--param=false"
        std::string negation_param = "no" + name;
        if (_args_map.count(negation_param))
            return false;

        try {
            std::string contents = _args_map.at(name);
            stringtools::to_lower(contents);

            // "--param=false"
            if (contents == "false")
                return false;

            // "--param=true" or "--param"
            return true;
        } catch (std::out_of_range&) {
            // No trace of "--param" or "--noParam", return default value
            return default_value;
        }
    }